

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoFast.c
# Opt level: O0

Vec_Int_t * Iso_StoCollectInfo(Iso_Sto_t *p,Aig_Obj_t *pPo)

{
  Iso_Dat_t *pIVar1;
  Aig_Man_t *p_00;
  int iVar2;
  int iVar3;
  uint uVar4;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar5;
  int *piVar6;
  Vec_Int_t *pVVar7;
  Iso_Dat_t *pData;
  Iso_Dat2_t Data;
  int *pPerm;
  int Entry;
  int Value;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pAig;
  Iso_Dat2_t *pData2;
  Vec_Int_t *vInfo;
  int fVerboseShow;
  Aig_Obj_t *pPo_local;
  Iso_Sto_t *p_local;
  
  pIVar1 = p->pData;
  p_00 = p->pAig;
  iVar2 = Aig_ObjIsCo(pPo);
  if (iVar2 == 0) {
    __assert_fail("Aig_ObjIsCo(pPo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoFast.c"
                  ,0xba,"Vec_Int_t *Iso_StoCollectInfo(Iso_Sto_t *, Aig_Obj_t *)");
  }
  Vec_IntClear(p->vVisited);
  Vec_PtrClear(p->vRoots);
  Vec_PtrPush(p->vRoots,pPo);
  for (Entry = 0; iVar2 = Vec_PtrSize(p->vRoots), Entry < iVar2; Entry = Entry + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vRoots,Entry);
    pAVar5 = Aig_ObjFanin0(pObj_00);
    iVar2 = Aig_ObjIsConst1(pAVar5);
    if (iVar2 == 0) {
      pAVar5 = Aig_ObjFanin0(pObj_00);
      iVar2 = Aig_ObjFaninC0(pObj_00);
      Iso_StoCollectInfo_rec(p_00,pAVar5,iVar2,p->vVisited,p->pData,p->vRoots);
    }
  }
  Vec_IntClear(p->vPlaces);
  for (Entry = 0; iVar2 = Vec_IntSize(p->vVisited), Entry < iVar2; Entry = Entry + 1) {
    iVar3 = Vec_IntEntry(p->vVisited,Entry);
    uVar4 = (uint)*(ushort *)(pIVar1 + iVar3);
    iVar2 = p->pCounters[(int)uVar4];
    p->pCounters[(int)uVar4] = iVar2 + 1;
    if (iVar2 == 0) {
      Vec_IntPush(p->vPlaces,uVar4);
    }
    p->pData[iVar3] = (Iso_Dat_t)0x0;
  }
  Vec_IntClear(p->vVisited);
  for (Entry = 0; iVar2 = Vec_IntSize(p->vPlaces), Entry < iVar2; Entry = Entry + 1) {
    iVar2 = Vec_IntEntry(p->vPlaces,Entry);
    if (p->pCounters[iVar2] == 0) {
      __assert_fail("p->pCounters[Entry]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoFast.c"
                    ,0xd7,"Vec_Int_t *Iso_StoCollectInfo(Iso_Sto_t *, Aig_Obj_t *)");
    }
    Vec_IntPush(p->vVisited,p->pCounters[iVar2]);
    p->pCounters[iVar2] = 0;
  }
  piVar6 = Vec_IntArray(p->vVisited);
  iVar2 = Vec_IntSize(p->vVisited);
  piVar6 = Abc_MergeSortCost(piVar6,iVar2);
  iVar2 = Vec_IntEntry(p->vVisited,*piVar6);
  pVVar7 = p->vVisited;
  iVar3 = Vec_IntSize(p->vVisited);
  iVar3 = Vec_IntEntry(pVVar7,piVar6[iVar3 + -1]);
  if (iVar2 <= iVar3) {
    iVar2 = Vec_IntSize(p->vVisited);
    pVVar7 = Vec_IntAlloc(iVar2);
    Entry = Vec_IntSize(p->vVisited);
    while (Entry = Entry + -1, -1 < Entry) {
      iVar2 = Vec_IntEntry(p->vVisited,piVar6[Entry]);
      uVar4 = Vec_IntEntry(p->vPlaces,piVar6[Entry]);
      Vec_IntPush(pVVar7,iVar2 << 0x10 | uVar4);
    }
    if (piVar6 != (int *)0x0) {
      free(piVar6);
    }
    return pVVar7;
  }
  __assert_fail("Vec_IntEntry(p->vVisited, pPerm[0]) <= Vec_IntEntry(p->vVisited, pPerm[Vec_IntSize(p->vVisited)-1])"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoFast.c"
                ,0xdf,"Vec_Int_t *Iso_StoCollectInfo(Iso_Sto_t *, Aig_Obj_t *)");
}

Assistant:

Vec_Int_t * Iso_StoCollectInfo( Iso_Sto_t * p, Aig_Obj_t * pPo )
{
    int fVerboseShow = 0;
    Vec_Int_t * vInfo;
    Iso_Dat2_t * pData2 = (Iso_Dat2_t *)p->pData;
    Aig_Man_t * pAig = p->pAig;
    Aig_Obj_t * pObj;
    int i, Value, Entry, * pPerm;
//    abctime clk = Abc_Clock();

    assert( Aig_ObjIsCo(pPo) );

    // collect initial POs
    Vec_IntClear( p->vVisited );
    Vec_PtrClear( p->vRoots );
    Vec_PtrPush( p->vRoots, pPo );

    // mark internal nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vRoots, pObj, i )
        if ( !Aig_ObjIsConst1(Aig_ObjFanin0(pObj)) )
            Iso_StoCollectInfo_rec( pAig, Aig_ObjFanin0(pObj), Aig_ObjFaninC0(pObj), p->vVisited, p->pData, p->vRoots );
//    time_Trav += Abc_Clock() - clk;

    // count how many times each data entry appears
    Vec_IntClear( p->vPlaces );
    Vec_IntForEachEntry( p->vVisited, Entry, i )
    {
        Value = pData2[Entry].Data;
//        assert( Value > 0 );
        if ( p->pCounters[Value]++ == 0 )
            Vec_IntPush( p->vPlaces, Value );
//        pData2[Entry].Data = 0;
        *((int *)(p->pData + Entry)) = 0;
    }

    // collect non-trivial counters
    Vec_IntClear( p->vVisited );
    Vec_IntForEachEntry( p->vPlaces, Entry, i )
    {
        assert( p->pCounters[Entry] );
        Vec_IntPush( p->vVisited, p->pCounters[Entry] );
        p->pCounters[Entry] = 0;
    }
//    printf( "%d ", Vec_IntSize(p->vVisited) );

    // sort the costs in the increasing order
    pPerm = Abc_MergeSortCost( Vec_IntArray(p->vVisited), Vec_IntSize(p->vVisited) );
    assert( Vec_IntEntry(p->vVisited, pPerm[0]) <= Vec_IntEntry(p->vVisited, pPerm[Vec_IntSize(p->vVisited)-1]) );

    // create information
    vInfo = Vec_IntAlloc( Vec_IntSize(p->vVisited) );
    for ( i = Vec_IntSize(p->vVisited)-1; i >= 0; i-- )
    {
        Entry = Vec_IntEntry( p->vVisited, pPerm[i] );
        Entry = (Entry << AIG_ISO_NUM) | Vec_IntEntry( p->vPlaces, pPerm[i] );
        Vec_IntPush( vInfo, Entry );
    }
    ABC_FREE( pPerm );

    // show the final result
    if ( fVerboseShow )
    Vec_IntForEachEntry( vInfo, Entry, i )
    {
        Iso_Dat2_t Data = { Entry & 0xFFFF };
        Iso_Dat_t * pData = (Iso_Dat_t *)&Data;

        printf( "%6d : ", i );
        printf( "Freq =%6d ", Entry >> 16 );

        printf( "FiNeg =%3d ", pData->nFiNeg );
        printf( "FoNeg =%3d ", pData->nFoNeg );
        printf( "FoPos =%3d ", pData->nFoPos );
        printf( "Fi0L  =%3d ", pData->Fi0Lev );
        printf( "Fi1L  =%3d ", pData->Fi1Lev );
        printf( "Lev   =%3d ", pData->Level  );
        printf( "\n" );
    }
    return vInfo;
}